

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

int Extra_bddSuppSize(DdManager *dd,DdNode *bSupp)

{
  int iVar1;
  
  iVar1 = 0;
  while( true ) {
    if (bSupp == dd->one) {
      return iVar1;
    }
    if (((ulong)bSupp & 1) != 0) break;
    if ((bSupp->type).kids.E != (DdNode *)((ulong)dd->one ^ 1)) {
      __assert_fail("cuddE(bSupp) == b0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                    ,0x147,"int Extra_bddSuppSize(DdManager *, DdNode *)");
    }
    bSupp = (bSupp->type).kids.T;
    iVar1 = iVar1 + 1;
  }
  __assert_fail("!Cudd_IsComplement(bSupp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                ,0x146,"int Extra_bddSuppSize(DdManager *, DdNode *)");
}

Assistant:

int Extra_bddSuppSize( DdManager * dd, DdNode * bSupp )
{
    int Counter = 0;
    while ( bSupp != b1 )
    {
        assert( !Cudd_IsComplement(bSupp) );
        assert( cuddE(bSupp) == b0 );

        bSupp = cuddT(bSupp);
        Counter++;
    }
    return Counter;
}